

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgphd(fitsfile *fptr,int maxdim,int *simple,int *bitpix,int *naxis,LONGLONG *naxes,long *pcount
          ,long *gcount,int *extend,double *bscale,double *bzero,LONGLONG *blank,int *nspace,
          int *status)

{
  int iVar1;
  char local_2b8 [8];
  char xtension [71];
  char local_268 [8];
  char comm [73];
  char value [71];
  char local_1c8 [8];
  char name [75];
  char card [81];
  char local_118 [8];
  char keyword [75];
  char message [81];
  LONGLONG axislen;
  long longnaxis;
  long longbitpix;
  int namelen;
  int nextkey;
  int ii;
  int tstatus;
  int found_end;
  int unknown;
  LONGLONG *naxes_local;
  int *naxis_local;
  int *bitpix_local;
  int *simple_local;
  fitsfile *pfStack_18;
  int maxdim_local;
  fitsfile *fptr_local;
  
  if (0 < *status) {
    return *status;
  }
  _found_end = naxes;
  naxes_local = (LONGLONG *)naxis;
  naxis_local = bitpix;
  bitpix_local = simple;
  simple_local._4_4_ = maxdim;
  pfStack_18 = fptr;
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (bitpix_local != (int *)0x0) {
    *bitpix_local = 1;
  }
  tstatus = 0;
  ffgkyn(pfStack_18,1,local_1c8,comm + 0x48,local_268,status);
  if (pfStack_18->Fptr->curhdu == 0) {
    iVar1 = strcmp(local_1c8,"SIMPLE");
    if (iVar1 != 0) {
      snprintf(keyword + 0x48,0x51,"First keyword of the file is not SIMPLE: %s",local_1c8);
      ffpmsg(keyword + 0x48);
      *status = 0xdd;
      return 0xdd;
    }
    if (comm[0x48] == 'F') {
      if (bitpix_local != (int *)0x0) {
        *bitpix_local = 0;
      }
    }
    else if (comm[0x48] != 'T') {
      *status = 0xdc;
      return 0xdc;
    }
  }
  else {
    iVar1 = strcmp(local_1c8,"XTENSION");
    if (iVar1 != 0) {
      snprintf(keyword + 0x48,0x51,"First keyword of the extension is not XTENSION: %s",local_1c8);
      ffpmsg(keyword + 0x48);
      *status = 0xe1;
      return 0xe1;
    }
    iVar1 = ffc2s(comm + 0x48,local_2b8,status);
    if (0 < iVar1) {
      ffpmsg("Bad value string for XTENSION keyword:");
      ffpmsg(comm + 0x48);
      return *status;
    }
    if ((comm[0x48] != '\'') ||
       ((iVar1 = strcmp(local_2b8,"IMAGE"), iVar1 != 0 &&
        (iVar1 = strcmp(local_2b8,"IUEIMAGE"), iVar1 != 0)))) {
      tstatus = 1;
      snprintf(keyword + 0x48,0x51,"This is not an IMAGE extension: %s",comm + 0x48);
      ffpmsg(keyword + 0x48);
    }
  }
  if ((tstatus == 0) || (pfStack_18->Fptr->compressimg == 0)) {
    ffgkyn(pfStack_18,2,local_1c8,comm + 0x48,local_268,status);
    iVar1 = strcmp(local_1c8,"BITPIX");
    if (iVar1 != 0) {
      snprintf(keyword + 0x48,0x51,"Second keyword of the extension is not BITPIX: %s",local_1c8);
      ffpmsg(keyword + 0x48);
      *status = 0xde;
      return 0xde;
    }
    iVar1 = ffc2ii(comm + 0x48,&longnaxis,status);
    if (0 < iVar1) {
      snprintf(keyword + 0x48,0x51,"Value of BITPIX keyword is not an integer: %s",comm + 0x48);
      ffpmsg(keyword + 0x48);
      *status = 0xd3;
      return 0xd3;
    }
    if (((((longnaxis != 8) && (longnaxis != 0x10)) && (longnaxis != 0x20)) &&
        ((longnaxis != 0x40 && (longnaxis != -0x20)))) && (longnaxis != -0x40)) {
      snprintf(keyword + 0x48,0x51,"Illegal value for BITPIX keyword: %s",comm + 0x48);
      ffpmsg(keyword + 0x48);
      *status = 0xd3;
      return 0xd3;
    }
    if (naxis_local != (int *)0x0) {
      *naxis_local = (int)longnaxis;
    }
    ffgtkn(pfStack_18,3,"NAXIS",&axislen,status);
    if (*status == 0xd0) {
      *status = 0xdf;
      return 0xdf;
    }
    if ((*status == 0xd1) || (999 < axislen)) {
      snprintf(keyword + 0x48,0x51,"NAXIS = %ld is illegal",axislen);
      ffpmsg(keyword + 0x48);
      *status = 0xd4;
      return 0xd4;
    }
    if (naxes_local != (LONGLONG *)0x0) {
      *(int *)naxes_local = (int)axislen;
    }
    longbitpix._4_4_ = 4;
    for (namelen = 0; namelen < axislen; namelen = namelen + 1) {
      ffkeyn("NAXIS",namelen + 1,local_118,status);
      ffgtknjj(pfStack_18,namelen + 4,local_118,(LONGLONG *)(message + 0x50),status);
      if (*status == 0xd0) {
        *status = 0xe0;
        return 0xe0;
      }
      if (*status == 0xd1) {
        *status = 0xd5;
        return 0xd5;
      }
      if ((namelen < simple_local._4_4_) && (_found_end != (LONGLONG *)0x0)) {
        _found_end[namelen] = stack0xffffffffffffff90;
      }
      longbitpix._4_4_ = longbitpix._4_4_ + 1;
    }
  }
  else {
    tstatus = 0;
    ffxmsg(3,keyword + 0x48);
    if ((naxis_local != (int *)0x0) && (ffgidt(pfStack_18,naxis_local,status), 0 < *status)) {
      ffpmsg("Error reading BITPIX value of compressed image");
      return *status;
    }
    if ((naxes_local != (LONGLONG *)0x0) &&
       (ffgidm(pfStack_18,(int *)naxes_local,status), 0 < *status)) {
      ffpmsg("Error reading NAXIS value of compressed image");
      return *status;
    }
    if ((_found_end != (LONGLONG *)0x0) &&
       (ffgiszll(pfStack_18,simple_local._4_4_,_found_end,status), 0 < *status)) {
      ffpmsg("Error reading NAXISn values of compressed image");
      return *status;
    }
    longbitpix._4_4_ = 9;
  }
  if (bscale != (double *)0x0) {
    *bscale = 1.0;
  }
  if (bzero != (double *)0x0) {
    *bzero = 0.0;
  }
  if (pcount != (long *)0x0) {
    *pcount = 0;
  }
  if (gcount != (long *)0x0) {
    *gcount = 1;
  }
  if (extend != (int *)0x0) {
    *extend = 0;
  }
  if (blank != (LONGLONG *)0x0) {
    *blank = 0x4995cdd1;
  }
  *nspace = 0;
  ii = 0;
  nextkey = *status;
  while( true ) {
    if (ii != 0) {
      if (tstatus != 0) {
        *status = 0xe9;
      }
      return *status;
    }
    iVar1 = ffgrec(pfStack_18,longbitpix._4_4_,name + 0x48,status);
    if (iVar1 < 1) {
      ffgknm(name + 0x48,local_1c8,(int *)&longbitpix,status);
      iVar1 = fftrec(local_1c8,status);
      if (0 < iVar1) {
        snprintf(keyword + 0x48,0x51,"Name of keyword no. %d contains illegal character(s): %s",
                 (ulong)longbitpix._4_4_,local_1c8);
        ffpmsg(keyword + 0x48);
        if ((int)longbitpix._4_4_ % 0x24 == 0) {
          ffpmsg("  (This may indicate a missing END keyword).");
        }
      }
      iVar1 = strcmp(local_1c8,"BSCALE");
      if ((iVar1 == 0) && (bscale != (double *)0x0)) {
        *nspace = 0;
        ffpsvc(name + 0x48,comm + 0x48,local_268,status);
        iVar1 = ffc2dd(comm + 0x48,bscale,status);
        if (0 < iVar1) {
          *status = nextkey;
          *bscale = 1.0;
          snprintf(keyword + 0x48,0x51,"Error reading BSCALE keyword value as a double: %s",
                   comm + 0x48);
          ffpmsg(keyword + 0x48);
        }
      }
      else {
        iVar1 = strcmp(local_1c8,"BZERO");
        if ((iVar1 == 0) && (bzero != (double *)0x0)) {
          *nspace = 0;
          ffpsvc(name + 0x48,comm + 0x48,local_268,status);
          iVar1 = ffc2dd(comm + 0x48,bzero,status);
          if (0 < iVar1) {
            *status = nextkey;
            *bzero = 0.0;
            snprintf(keyword + 0x48,0x51,"Error reading BZERO keyword value as a double: %s",
                     comm + 0x48);
            ffpmsg(keyword + 0x48);
          }
        }
        else {
          iVar1 = strcmp(local_1c8,"BLANK");
          if ((iVar1 == 0) && (blank != (LONGLONG *)0x0)) {
            *nspace = 0;
            ffpsvc(name + 0x48,comm + 0x48,local_268,status);
            iVar1 = ffc2jj(comm + 0x48,blank,status);
            if (0 < iVar1) {
              *status = nextkey;
              *blank = 0x4995cdd1;
              snprintf(keyword + 0x48,0x51,"Error reading BLANK keyword value as an integer: %s",
                       comm + 0x48);
              ffpmsg(keyword + 0x48);
            }
          }
          else {
            iVar1 = strcmp(local_1c8,"PCOUNT");
            if ((iVar1 == 0) && (pcount != (long *)0x0)) {
              *nspace = 0;
              ffpsvc(name + 0x48,comm + 0x48,local_268,status);
              iVar1 = ffc2ii(comm + 0x48,pcount,status);
              if (0 < iVar1) {
                snprintf(keyword + 0x48,0x51,"Error reading PCOUNT keyword value as an integer: %s",
                         comm + 0x48);
                ffpmsg(keyword + 0x48);
              }
            }
            else {
              iVar1 = strcmp(local_1c8,"GCOUNT");
              if ((iVar1 == 0) && (gcount != (long *)0x0)) {
                *nspace = 0;
                ffpsvc(name + 0x48,comm + 0x48,local_268,status);
                iVar1 = ffc2ii(comm + 0x48,gcount,status);
                if (0 < iVar1) {
                  snprintf(keyword + 0x48,0x51,
                           "Error reading GCOUNT keyword value as an integer: %s",comm + 0x48);
                  ffpmsg(keyword + 0x48);
                }
              }
              else {
                iVar1 = strcmp(local_1c8,"EXTEND");
                if ((iVar1 == 0) && (extend != (int *)0x0)) {
                  *nspace = 0;
                  ffpsvc(name + 0x48,comm + 0x48,local_268,status);
                  iVar1 = ffc2ll(comm + 0x48,extend,status);
                  if (0 < iVar1) {
                    *status = nextkey;
                    *extend = 0;
                    snprintf(keyword + 0x48,0x51,
                             "Error reading EXTEND keyword value as a logical: %s",comm + 0x48);
                    ffpmsg(keyword + 0x48);
                  }
                }
                else {
                  iVar1 = strcmp(local_1c8,"END");
                  if (iVar1 == 0) {
                    ii = 1;
                  }
                  else if (name[0x48] == '\0') {
                    *nspace = *nspace + 1;
                  }
                  else {
                    *nspace = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (*status == 0xcb) {
      ii = 1;
      *status = nextkey;
    }
    else {
      ffpmsg("Failed to find the END keyword in header (ffgphd).");
    }
    if (0 < *status) break;
    longbitpix._4_4_ = longbitpix._4_4_ + 1;
  }
  if (pfStack_18->Fptr->curhdu == 0) {
    ffpmsg("Failed to read the required primary array header keywords.");
  }
  else {
    ffpmsg("Failed to read the required image extension header keywords.");
  }
  return *status;
}

Assistant:

int ffgphd(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *simple,     /* O - does file conform to FITS standard? 1/0  */
           int *bitpix,     /* O - number of bits per data value pixel      */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[],    /* O - length of each data axis                 */
           long *pcount,    /* O - number of group parameters (usually 0)   */
           long *gcount,    /* O - number of random groups (usually 1 or 0) */
           int *extend,     /* O - may FITS file haave extensions?          */
           double *bscale,  /* O - array pixel linear scaling factor        */
           double *bzero,   /* O - array pixel linear scaling zero point    */
           LONGLONG *blank, /* O - value used to represent undefined pixels */
           int *nspace,     /* O - number of blank keywords prior to END    */
           int *status)     /* IO - error status                            */
{
/*
  Get the Primary HeaDer parameters.  Check that the keywords conform to
  the FITS standard and return the parameters which determine the size and
  structure of the primary array or IMAGE extension.
*/
    int unknown, found_end, tstatus, ii, nextkey, namelen;
    long longbitpix, longnaxis;
    LONGLONG axislen;
    char message[FLEN_ERRMSG], keyword[FLEN_KEYWORD];
    char card[FLEN_CARD];
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xtension[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (simple)
       *simple = 1;

    unknown = 0;

    /*--------------------------------------------------------------------*/
    /*  Get 1st keyword of HDU and test whether it is SIMPLE or XTENSION  */
    /*--------------------------------------------------------------------*/
    ffgkyn(fptr, 1, name, value, comm, status);

    if ((fptr->Fptr)->curhdu == 0) /* Is this the beginning of the FITS file? */
    {
        if (!strcmp(name, "SIMPLE"))
        {
            if (value[0] == 'F')
            {
                if (simple)
                    *simple=0;          /* not a simple FITS file */
            }
            else if (value[0] != 'T')
                return(*status = BAD_SIMPLE);
        }

        else
        {
            snprintf(message, FLEN_ERRMSG,
                   "First keyword of the file is not SIMPLE: %s", name);
            ffpmsg(message);
            return(*status = NO_SIMPLE);
        }
    }

    else    /* not beginning of the file, so presumably an IMAGE extension */
    {       /* or it could be a compressed image in a binary table */

        if (!strcmp(name, "XTENSION"))
        {
            if (ffc2s(value, xtension, status) > 0)  /* get the value string */
            {
                ffpmsg("Bad value string for XTENSION keyword:");
                ffpmsg(value);
                return(*status);
            }

            /* allow the quoted string value to begin in any column and */
            /* allow any number of trailing blanks before the closing quote */
            if ( (value[0] != '\'')   ||  /* first char must be a quote */
                  ( strcmp(xtension, "IMAGE")  &&
                    strcmp(xtension, "IUEIMAGE") ) )
            {
                unknown = 1;  /* unknown type of extension; press on anyway */
                snprintf(message, FLEN_ERRMSG,
                   "This is not an IMAGE extension: %s", value);
                ffpmsg(message);
            }
        }

        else  /* error: 1st keyword of extension != XTENSION */
        {
            snprintf(message, FLEN_ERRMSG,
            "First keyword of the extension is not XTENSION: %s", name);
            ffpmsg(message);
            return(*status = NO_XTENSION);
        }
    }

    if (unknown && (fptr->Fptr)->compressimg)
    {
        /* this is a compressed image, so read ZBITPIX, ZNAXIS keywords */
        unknown = 0;  /* reset flag */
        ffxmsg(3, message); /* clear previous spurious error message */

        if (bitpix)
        {
            ffgidt(fptr, bitpix, status); /* get bitpix value */

            if (*status > 0)
            {
                ffpmsg("Error reading BITPIX value of compressed image");
                return(*status);
            }
        }

        if (naxis)
        {
            ffgidm(fptr, naxis, status); /* get NAXIS value */

            if (*status > 0)
            {
                ffpmsg("Error reading NAXIS value of compressed image");
                return(*status);
            }
        }

        if (naxes)
        {
            ffgiszll(fptr, maxdim, naxes, status);  /* get NAXISn value */

            if (*status > 0)
            {
                ffpmsg("Error reading NAXISn values of compressed image");
                return(*status);
            }
        }

        nextkey = 9; /* skip required table keywords in the following search */
    }
    else
    {

        /*----------------------------------------------------------------*/
        /*  Get 2nd keyword;  test whether it is BITPIX with legal value  */
        /*----------------------------------------------------------------*/
        ffgkyn(fptr, 2, name, value, comm, status);  /* BITPIX = 2nd keyword */

        if (strcmp(name, "BITPIX"))
        {
            snprintf(message, FLEN_ERRMSG,
            "Second keyword of the extension is not BITPIX: %s", name);
            ffpmsg(message);
            return(*status = NO_BITPIX);
        }

        if (ffc2ii(value,  &longbitpix, status) > 0)
        {
            snprintf(message, FLEN_ERRMSG,
            "Value of BITPIX keyword is not an integer: %s", value);
            ffpmsg(message);
            return(*status = BAD_BITPIX);
        }
        else if (longbitpix != BYTE_IMG && longbitpix != SHORT_IMG &&
             longbitpix != LONG_IMG && longbitpix != LONGLONG_IMG &&
             longbitpix != FLOAT_IMG && longbitpix != DOUBLE_IMG)
        {
            snprintf(message, FLEN_ERRMSG,
            "Illegal value for BITPIX keyword: %s", value);
            ffpmsg(message);
            return(*status = BAD_BITPIX);
        }
        if (bitpix)
            *bitpix = longbitpix;  /* do explicit type conversion */

        /*---------------------------------------------------------------*/
        /*  Get 3rd keyword;  test whether it is NAXIS with legal value  */
        /*---------------------------------------------------------------*/
        ffgtkn(fptr, 3, "NAXIS",  &longnaxis, status);

        if (*status == BAD_ORDER)
            return(*status = NO_NAXIS);
        else if (*status == NOT_POS_INT || longnaxis > 999)
        {
            snprintf(message,FLEN_ERRMSG,"NAXIS = %ld is illegal", longnaxis);
            ffpmsg(message);
            return(*status = BAD_NAXIS);
        }
        else
            if (naxis)
                 *naxis = longnaxis;  /* do explicit type conversion */

        /*---------------------------------------------------------*/
        /*  Get the next NAXISn keywords and test for legal values */
        /*---------------------------------------------------------*/
        for (ii=0, nextkey=4; ii < longnaxis; ii++, nextkey++)
        {
            ffkeyn("NAXIS", ii+1, keyword, status);
            ffgtknjj(fptr, 4+ii, keyword, &axislen, status);

            if (*status == BAD_ORDER)
                return(*status = NO_NAXES);
            else if (*status == NOT_POS_INT)
                return(*status = BAD_NAXES);
            else if (ii < maxdim)
                if (naxes)
                    naxes[ii] = axislen;
        }
    }

    /*---------------------------------------------------------*/
    /*  now look for other keywords of interest:               */
    /*  BSCALE, BZERO, BLANK, PCOUNT, GCOUNT, EXTEND, and END  */
    /*---------------------------------------------------------*/

    /*  initialize default values in case keyword is not present */
    if (bscale)
        *bscale = 1.0;
    if (bzero)
        *bzero  = 0.0;
    if (pcount)
        *pcount = 0;
    if (gcount)
        *gcount = 1;
    if (extend)
        *extend = 0;
    if (blank)
      *blank = NULL_UNDEFINED; /* no default null value for BITPIX=8,16,32 */

    *nspace = 0;
    found_end = 0;
    tstatus = *status;

    for (; !found_end; nextkey++)  
    {
      /* get next keyword */
      /* don't use ffgkyn here because it trys to parse the card to read */
      /* the value string, thus failing to read the file just because of */
      /* minor syntax errors in optional keywords.                       */

      if (ffgrec(fptr, nextkey, card, status) > 0 )  /* get the 80-byte card */
      {
        if (*status == KEY_OUT_BOUNDS)
        {
          found_end = 1;  /* simply hit the end of the header */
          *status = tstatus;  /* reset error status */
        }
        else          
        {
          ffpmsg("Failed to find the END keyword in header (ffgphd).");
        }
      }
      else /* got the next keyword without error */
      {
        ffgknm(card, name, &namelen, status); /* get the keyword name */

        if (fftrec(name, status) > 0)  /* test keyword name; catches no END */
        {
          snprintf(message, FLEN_ERRMSG,
              "Name of keyword no. %d contains illegal character(s): %s",
              nextkey, name);
          ffpmsg(message);

          if (nextkey % 36 == 0) /* test if at beginning of 36-card record */
            ffpmsg("  (This may indicate a missing END keyword).");
        }

        if (!strcmp(name, "BSCALE") && bscale)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2dd(value, bscale, status) > 0) /* convert to double */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *bscale = 1.0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BSCALE keyword value as a double: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "BZERO") && bzero)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2dd(value, bzero, status) > 0) /* convert to double */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *bzero = 0.0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BZERO keyword value as a double: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "BLANK") && blank)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2jj(value, blank, status) > 0) /* convert to LONGLONG */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *blank = NULL_UNDEFINED;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BLANK keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "PCOUNT") && pcount)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ii(value, pcount, status) > 0) /* convert to long */
            {
                snprintf(message, FLEN_ERRMSG,
                "Error reading PCOUNT keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "GCOUNT") && gcount)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ii(value, gcount, status) > 0) /* convert to long */
            {
                snprintf(message, FLEN_ERRMSG,
                "Error reading GCOUNT keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "EXTEND") && extend)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ll(value, extend, status) > 0) /* convert to logical */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *extend = 0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading EXTEND keyword value as a logical: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "END"))
            found_end = 1;

        else if (!card[0] )
            *nspace = *nspace + 1;  /* this is a blank card in the header */

        else
            *nspace = 0;  /* reset count of blank keywords immediately
                            before the END keyword to zero   */
      }

      if (*status > 0)  /* exit on error after writing error message */
      {
        if ((fptr->Fptr)->curhdu == 0)
            ffpmsg(
            "Failed to read the required primary array header keywords.");
        else
            ffpmsg(
            "Failed to read the required image extension header keywords.");

        return(*status);
      }
    }

    if (unknown)
       *status = NOT_IMAGE;

    return(*status);
}